

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

void __thiscall GdlLookupExpression::GlyphAttrCheck(GdlLookupExpression *this,Symbol param_2)

{
  bool bVar1;
  string *in_RDI;
  undefined8 in_stack_fffffffffffffee0;
  SymbolType symt;
  GrcSymbolTableEntry *in_stack_fffffffffffffee8;
  string *in_stack_ffffffffffffff10;
  allocator *paVar2;
  GdlObject *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  GrcErrorList *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  GrcErrorList *in_stack_ffffffffffffff40;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  symt = (SymbolType)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  bVar1 = GrcSymbolTableEntry::FitsSymbolType(in_stack_fffffffffffffee8,symt);
  if (!bVar1) {
    bVar1 = GrcSymbolTableEntry::FitsSymbolType(in_stack_fffffffffffffee8,symt);
    if (bVar1) {
      paVar2 = &local_31;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_30,"Slot attribute references are not permitted in glyph attribute values",
                 paVar2);
      GrcErrorList::AddError
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                 (GdlObject *)in_stack_ffffffffffffff30,
                 (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
    }
    else {
      bVar1 = GrcSymbolTableEntry::FitsSymbolType(in_stack_fffffffffffffee8,symt);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_68,"Feature references are not permitted in glyph attribute values",
                   &local_69);
        GrcErrorList::AddError
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                   (GdlObject *)in_stack_ffffffffffffff30,
                   (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
      }
      else {
        bVar1 = GrcSymbolTableEntry::FitsSymbolType(in_stack_fffffffffffffee8,symt);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_90,
                     "Processing-state references are not permitted in glyph attribute values",
                     &local_91);
          GrcErrorList::AddError
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                     (GdlObject *)in_stack_ffffffffffffff30,
                     (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          std::__cxx11::string::~string(local_90);
          std::allocator<char>::~allocator((allocator<char> *)&local_91);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_b8,"Unknown attribute: ",(allocator *)&stack0xffffffffffffff47);
          GrcSymbolTableEntry::FullName_abi_cxx11_
                    ((GrcSymbolTableEntry *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          GrcErrorList::AddError
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,
                     in_RDI,in_stack_ffffffffffffff10);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
          std::__cxx11::string::~string(local_b8);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
        }
      }
    }
  }
  return;
}

Assistant:

void GdlLookupExpression::GlyphAttrCheck(Symbol /*psymAttr*/)
{
	if (m_psymName->FitsSymbolType(ksymtGlyphData))
	{
		//	okay
	}
	else if (m_psymName->FitsSymbolType(ksymtSlotAttr))
	{
		g_errorList.AddError(2108, this,
			"Slot attribute references are not permitted in glyph attribute values");
	}
	else if (m_psymName->FitsSymbolType(ksymtFeature))
	{
		g_errorList.AddError(2109, this,
			"Feature references are not permitted in glyph attribute values");
	}
	else if (m_psymName->FitsSymbolType(ksymtProcState))
	{
		g_errorList.AddError(2110, this,
			"Processing-state references are not permitted in glyph attribute values");
	}
	else
	{
		g_errorList.AddError(2111, this,
			"Unknown attribute: ",
			m_psymName->FullName());
	}
}